

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O0

void __thiscall
icu_63::CjkBreakEngine::CjkBreakEngine
          (CjkBreakEngine *this,DictionaryMatcher *adoptDictionary,LanguageType type,
          UErrorCode *status)

{
  UBool UVar1;
  Normalizer2 *pNVar2;
  undefined1 local_1b0 [8];
  UnicodeSet cjSet;
  UnicodeString local_150;
  ConstChar16Ptr local_110;
  UnicodeString local_108;
  ConstChar16Ptr local_c8;
  UnicodeString local_c0;
  ConstChar16Ptr local_80;
  UnicodeString local_78;
  UErrorCode *local_28;
  UErrorCode *status_local;
  DictionaryMatcher *pDStack_18;
  LanguageType type_local;
  DictionaryMatcher *adoptDictionary_local;
  CjkBreakEngine *this_local;
  
  local_28 = status;
  status_local._4_4_ = type;
  pDStack_18 = adoptDictionary;
  adoptDictionary_local = (DictionaryMatcher *)this;
  DictionaryBreakEngine::DictionaryBreakEngine(&this->super_DictionaryBreakEngine);
  (this->super_DictionaryBreakEngine).super_LanguageBreakEngine._vptr_LanguageBreakEngine =
       (_func_int **)&PTR__CjkBreakEngine_005025e0;
  UnicodeSet::UnicodeSet(&this->fHangulWordSet);
  UnicodeSet::UnicodeSet(&this->fHanWordSet);
  UnicodeSet::UnicodeSet(&this->fKatakanaWordSet);
  UnicodeSet::UnicodeSet(&this->fHiraganaWordSet);
  this->fDictionary = pDStack_18;
  ConstChar16Ptr::ConstChar16Ptr(&local_80,L"[\\uac00-\\ud7a3]");
  UnicodeString::UnicodeString(&local_78,'\x01',&local_80,-1);
  UnicodeSet::applyPattern(&this->fHangulWordSet,&local_78,local_28);
  UnicodeString::~UnicodeString(&local_78);
  ConstChar16Ptr::~ConstChar16Ptr(&local_80);
  ConstChar16Ptr::ConstChar16Ptr(&local_c8,L"[:Han:]");
  UnicodeString::UnicodeString(&local_c0,'\x01',&local_c8,-1);
  UnicodeSet::applyPattern(&this->fHanWordSet,&local_c0,local_28);
  UnicodeString::~UnicodeString(&local_c0);
  ConstChar16Ptr::~ConstChar16Ptr(&local_c8);
  ConstChar16Ptr::ConstChar16Ptr(&local_110,L"[[:Katakana:]\\uff9e\\uff9f]");
  UnicodeString::UnicodeString(&local_108,'\x01',&local_110,-1);
  UnicodeSet::applyPattern(&this->fKatakanaWordSet,&local_108,local_28);
  UnicodeString::~UnicodeString(&local_108);
  ConstChar16Ptr::~ConstChar16Ptr(&local_110);
  ConstChar16Ptr::ConstChar16Ptr((ConstChar16Ptr *)&cjSet.fFlags,L"[:Hiragana:]");
  UnicodeString::UnicodeString(&local_150,'\x01',(ConstChar16Ptr *)&cjSet.fFlags,-1);
  UnicodeSet::applyPattern(&this->fHiraganaWordSet,&local_150,local_28);
  UnicodeString::~UnicodeString(&local_150);
  ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&cjSet.fFlags);
  pNVar2 = Normalizer2::getNFKCInstance(local_28);
  this->nfkcNorm2 = pNVar2;
  UVar1 = ::U_SUCCESS(*local_28);
  if (UVar1 != '\0') {
    if (status_local._4_4_ == kKorean) {
      (*(this->super_DictionaryBreakEngine).super_LanguageBreakEngine._vptr_LanguageBreakEngine[4])
                (this,&this->fHangulWordSet);
    }
    else {
      UnicodeSet::UnicodeSet((UnicodeSet *)local_1b0);
      UnicodeSet::addAll((UnicodeSet *)local_1b0,&this->fHanWordSet);
      UnicodeSet::addAll((UnicodeSet *)local_1b0,&this->fKatakanaWordSet);
      UnicodeSet::addAll((UnicodeSet *)local_1b0,&this->fHiraganaWordSet);
      UnicodeSet::add((UnicodeSet *)local_1b0,0xff70);
      UnicodeSet::add((UnicodeSet *)local_1b0,0x30fc);
      (*(this->super_DictionaryBreakEngine).super_LanguageBreakEngine._vptr_LanguageBreakEngine[4])
                (this,local_1b0);
      UnicodeSet::~UnicodeSet((UnicodeSet *)local_1b0);
    }
  }
  return;
}

Assistant:

CjkBreakEngine::CjkBreakEngine(DictionaryMatcher *adoptDictionary, LanguageType type, UErrorCode &status)
: DictionaryBreakEngine(), fDictionary(adoptDictionary) {
    // Korean dictionary only includes Hangul syllables
    fHangulWordSet.applyPattern(UNICODE_STRING_SIMPLE("[\\uac00-\\ud7a3]"), status);
    fHanWordSet.applyPattern(UNICODE_STRING_SIMPLE("[:Han:]"), status);
    fKatakanaWordSet.applyPattern(UNICODE_STRING_SIMPLE("[[:Katakana:]\\uff9e\\uff9f]"), status);
    fHiraganaWordSet.applyPattern(UNICODE_STRING_SIMPLE("[:Hiragana:]"), status);
    nfkcNorm2 = Normalizer2::getNFKCInstance(status);

    if (U_SUCCESS(status)) {
        // handle Korean and Japanese/Chinese using different dictionaries
        if (type == kKorean) {
            setCharacters(fHangulWordSet);
        } else { //Chinese and Japanese
            UnicodeSet cjSet;
            cjSet.addAll(fHanWordSet);
            cjSet.addAll(fKatakanaWordSet);
            cjSet.addAll(fHiraganaWordSet);
            cjSet.add(0xFF70); // HALFWIDTH KATAKANA-HIRAGANA PROLONGED SOUND MARK
            cjSet.add(0x30FC); // KATAKANA-HIRAGANA PROLONGED SOUND MARK
            setCharacters(cjSet);
        }
    }
}